

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_horizontal_8_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 (*pauVar15) [16];
  undefined8 *puVar16;
  __m128i *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  __m128i *in_R8;
  __m128i *in_R9;
  ushort uVar17;
  ushort uVar18;
  ulong uVar19;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  undefined1 auVar20 [16];
  ulong uVar33;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  undefined1 auVar44 [16];
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  __m128i q3;
  __m128i p3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i workp_b;
  __m128i workp_a;
  __m128i q [2];
  __m128i p_1 [2];
  __m128i qs [2];
  __m128i ps [2];
  __m128i ffff;
  __m128i one;
  __m128i four;
  __m128i zero;
  __m128i work2;
  __m128i work1;
  __m128i work0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i oq1;
  __m128i oq0;
  __m128i op0;
  __m128i op1;
  __m128i oq2;
  __m128i op2;
  __m128i work_a;
  __m128i flat;
  __m128i mask;
  __m128i t80;
  __m128i thresh0;
  __m128i limit0;
  __m128i blimit0;
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [16];
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  undefined1 local_1478 [16];
  undefined1 local_1468 [8];
  __m128i *th;
  __m128i *mask_00;
  __m128i *qs_00;
  ulong local_12b8;
  ulong uStack_12b0;
  ulong local_12a8;
  ulong uStack_12a0;
  ulong local_1298;
  ulong uStack_1290;
  ulong local_1288;
  ulong uStack_1280;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  longlong local_1158 [2];
  longlong local_1148 [2];
  longlong local_1138;
  longlong lStack_1130;
  longlong local_1128;
  longlong lStack_1120;
  int local_110c;
  undefined1 (*local_10d8) [16];
  undefined1 (*local_10d0) [16];
  undefined1 (*local_10c8) [16];
  undefined1 (*local_10c0) [16];
  undefined1 (*local_10b8) [16];
  undefined1 (*local_10b0) [16];
  undefined1 (*local_10a8) [16];
  undefined1 (*local_10a0) [16];
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined1 local_fa8 [16];
  ulong local_f98;
  ulong uStack_f90;
  short local_f68;
  short sStack_f66;
  short sStack_f64;
  short sStack_f62;
  short sStack_f60;
  short sStack_f5e;
  short sStack_f5c;
  short sStack_f5a;
  short local_f48;
  short sStack_f46;
  short sStack_f44;
  short sStack_f42;
  short sStack_f40;
  short sStack_f3e;
  short sStack_f3c;
  short sStack_f3a;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined2 local_ecc;
  undefined2 local_eca;
  short local_ea8;
  short sStack_ea6;
  short sStack_ea4;
  short sStack_ea2;
  short sStack_ea0;
  short sStack_e9e;
  short sStack_e9c;
  short sStack_e9a;
  short local_e88;
  short sStack_e86;
  short sStack_e84;
  short sStack_e82;
  short sStack_e80;
  short sStack_e7e;
  short sStack_e7c;
  short sStack_e7a;
  short local_e48;
  short sStack_e46;
  short sStack_e44;
  short sStack_e42;
  short sStack_e40;
  short sStack_e3e;
  short sStack_e3c;
  short sStack_e3a;
  short local_e28;
  short sStack_e26;
  short sStack_e24;
  short sStack_e22;
  short sStack_e20;
  short sStack_e1e;
  short sStack_e1c;
  short sStack_e1a;
  short local_de8;
  short sStack_de6;
  short sStack_de4;
  short sStack_de2;
  short sStack_de0;
  short sStack_dde;
  short sStack_ddc;
  short sStack_dda;
  short local_dc8;
  short sStack_dc6;
  short sStack_dc4;
  short sStack_dc2;
  short sStack_dc0;
  short sStack_dbe;
  short sStack_dbc;
  short sStack_dba;
  short local_d88;
  short sStack_d86;
  short sStack_d84;
  short sStack_d82;
  short sStack_d80;
  short sStack_d7e;
  short sStack_d7c;
  short sStack_d7a;
  short local_d68;
  short sStack_d66;
  short sStack_d64;
  short sStack_d62;
  short sStack_d60;
  short sStack_d5e;
  short sStack_d5c;
  short sStack_d5a;
  short local_d28;
  short sStack_d26;
  short sStack_d24;
  short sStack_d22;
  short sStack_d20;
  short sStack_d1e;
  short sStack_d1c;
  short sStack_d1a;
  short local_d08;
  short sStack_d06;
  short sStack_d04;
  short sStack_d02;
  short sStack_d00;
  short sStack_cfe;
  short sStack_cfc;
  short sStack_cfa;
  short local_cf8;
  short sStack_cf6;
  short sStack_cf4;
  short sStack_cf2;
  short sStack_cf0;
  short sStack_cee;
  short sStack_cec;
  short sStack_cea;
  short local_cc8;
  short sStack_cc6;
  short sStack_cc4;
  short sStack_cc2;
  short sStack_cc0;
  short sStack_cbe;
  short sStack_cbc;
  short sStack_cba;
  short local_ca8;
  short sStack_ca6;
  short sStack_ca4;
  short sStack_ca2;
  short sStack_ca0;
  short sStack_c9e;
  short sStack_c9c;
  short sStack_c9a;
  short local_c98;
  short sStack_c96;
  short sStack_c94;
  short sStack_c92;
  short sStack_c90;
  short sStack_c8e;
  short sStack_c8c;
  short sStack_c8a;
  short local_c88;
  short sStack_c86;
  short sStack_c84;
  short sStack_c82;
  short sStack_c80;
  short sStack_c7e;
  short sStack_c7c;
  short sStack_c7a;
  short local_c28;
  short sStack_c26;
  short sStack_c24;
  short sStack_c22;
  short sStack_c20;
  short sStack_c1e;
  short sStack_c1c;
  short sStack_c1a;
  short local_c18;
  short sStack_c16;
  short sStack_c14;
  short sStack_c12;
  short sStack_c10;
  short sStack_c0e;
  short sStack_c0c;
  short sStack_c0a;
  short local_bf8;
  short sStack_bf6;
  short sStack_bf4;
  short sStack_bf2;
  short sStack_bf0;
  short sStack_bee;
  short sStack_bec;
  short sStack_bea;
  short local_be8;
  short sStack_be6;
  short sStack_be4;
  short sStack_be2;
  short sStack_be0;
  short sStack_bde;
  short sStack_bdc;
  short sStack_bda;
  short local_bc8;
  short sStack_bc6;
  short sStack_bc4;
  short sStack_bc2;
  short sStack_bc0;
  short sStack_bbe;
  short sStack_bbc;
  short sStack_bba;
  short local_ba8;
  short sStack_ba6;
  short sStack_ba4;
  short sStack_ba2;
  short sStack_ba0;
  short sStack_b9e;
  short sStack_b9c;
  short sStack_b9a;
  short local_b88;
  short sStack_b86;
  short sStack_b84;
  short sStack_b82;
  short sStack_b80;
  short sStack_b7e;
  short sStack_b7c;
  short sStack_b7a;
  short local_b68;
  short sStack_b66;
  short sStack_b64;
  short sStack_b62;
  short sStack_b60;
  short sStack_b5e;
  short sStack_b5c;
  short sStack_b5a;
  short local_b48;
  short sStack_b46;
  short sStack_b44;
  short sStack_b42;
  int in_stack_fffffffffffff4c0;
  short sStack_b3c;
  short sStack_b3a;
  __m128i *in_stack_fffffffffffff4c8;
  short local_b28;
  short sStack_b26;
  short sStack_b24;
  short sStack_b22;
  short sStack_b20;
  short sStack_b1e;
  short sStack_b1c;
  short sStack_b1a;
  short local_b08;
  short sStack_b06;
  short sStack_b04;
  short sStack_b02;
  short sStack_b00;
  short sStack_afe;
  short sStack_afc;
  short sStack_afa;
  ushort local_a18;
  ushort uStack_a16;
  ushort uStack_a14;
  ushort uStack_a12;
  ushort uStack_a10;
  ushort uStack_a0e;
  ushort uStack_a0c;
  ushort uStack_a0a;
  uint local_a08;
  uint uStack_a04;
  uint uStack_a00;
  uint uStack_9fc;
  uint local_9f8;
  uint uStack_9f4;
  uint uStack_9f0;
  uint uStack_9ec;
  ulong local_848;
  ulong uStack_840;
  ulong local_838;
  ulong uStack_830;
  ulong local_808;
  ulong uStack_800;
  ulong local_7f8;
  ulong uStack_7f0;
  ulong local_7c8;
  ulong uStack_7c0;
  ulong local_7b8;
  ulong uStack_7b0;
  ulong local_788;
  ulong uStack_780;
  ulong local_778;
  ulong uStack_770;
  ulong local_748;
  ulong uStack_740;
  ulong local_738;
  ulong uStack_730;
  ulong local_708;
  ulong uStack_700;
  ulong local_6f8;
  ulong uStack_6f0;
  ulong local_6c8;
  ulong uStack_6c0;
  ulong local_6b8;
  ulong uStack_6b0;
  ulong local_688;
  ulong uStack_680;
  ulong local_678;
  ulong uStack_670;
  ulong local_648;
  ulong uStack_640;
  ulong local_638;
  ulong uStack_630;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  ulong uStack_5f0;
  ulong local_5c8;
  ulong uStack_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  ulong local_588;
  ulong uStack_580;
  ulong local_578;
  ulong uStack_570;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 2) * -2);
  local_14b8._0_8_ = *puVar16;
  local_14b8._8_8_ = puVar16[1];
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3) * 2);
  local_14c8._0_8_ = *puVar16;
  local_14c8._8_8_ = puVar16[1];
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3) * -2);
  mask_00 = (__m128i *)*puVar16;
  qs_00 = (__m128i *)puVar16[1];
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * 2);
  local_14a8._0_8_ = *puVar16;
  local_14a8._8_8_ = puVar16[1];
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * -2);
  local_1468 = (undefined1  [8])*puVar16;
  th = (__m128i *)puVar16[1];
  puVar16 = (undefined8 *)((long)in_RDI + (long)in_ESI * 2);
  local_1498._0_8_ = *puVar16;
  local_1498._8_8_ = puVar16[1];
  puVar16 = (undefined8 *)((long)in_RDI + (long)in_ESI * -2);
  local_1478._0_8_ = *puVar16;
  local_1478._8_8_ = puVar16[1];
  local_1488._0_8_ = *in_RDI;
  local_1488._8_8_ = in_RDI[1];
  local_10a0 = &local_14b8;
  local_10a8 = &local_14c8;
  local_10b0 = (undefined1 (*) [16])&stack0xffffffffffffeba8;
  local_10b8 = &local_14a8;
  local_10c0 = (undefined1 (*) [16])local_1468;
  local_10c8 = &local_1498;
  local_10d0 = &local_1478;
  local_10d8 = &local_1488;
  local_110c = in_stack_00000018;
  local_1098 = 0;
  uStack_1090 = 0;
  local_eca = 4;
  local_ecc = 1;
  local_ef8 = 0x1000100010001;
  uStack_ef0 = 0x1000100010001;
  local_ee8 = local_ef8;
  uStack_ee0 = uStack_ef0;
  get_limit_dual(in_RDX,(uint8_t *)in_RCX,(uint8_t *)in_R8,(uint8_t *)in_R9,in_stack_00000008,
                 in_stack_00000010,in_stack_00000018,(__m128i *)&local_1128,(__m128i *)&local_1138,
                 &local_1148,&local_1158);
  auVar44 = psubusw(*local_10d0,*local_10d8);
  auVar20 = psubusw(*local_10d8,*local_10d0);
  local_578 = auVar44._0_8_;
  uStack_570 = auVar44._8_8_;
  local_588 = auVar20._0_8_;
  uStack_580 = auVar20._8_8_;
  auVar44 = psubusw(*local_10c0,*local_10c8);
  auVar20 = psubusw(*local_10c8,*local_10c0);
  local_5b8 = auVar44._0_8_;
  uStack_5b0 = auVar44._8_8_;
  local_5c8 = auVar20._0_8_;
  uStack_5c0 = auVar20._8_8_;
  local_5b8 = local_5b8 | local_5c8;
  uStack_5b0 = uStack_5b0 | uStack_5c0;
  auVar10._8_8_ = uStack_570 | uStack_580;
  auVar10._0_8_ = local_578 | local_588;
  auVar9._8_8_ = uStack_570 | uStack_580;
  auVar9._0_8_ = local_578 | local_588;
  auVar20 = paddusw(auVar10,auVar9);
  local_a18 = (ushort)local_5b8;
  uStack_a16 = (ushort)(local_5b8 >> 0x10);
  uStack_a14 = (ushort)(local_5b8 >> 0x20);
  uStack_a10 = (ushort)uStack_5b0;
  uStack_a0e = (ushort)(uStack_5b0 >> 0x10);
  uStack_a0c = (ushort)(uStack_5b0 >> 0x20);
  local_11f8 = CONCAT26((ushort)(local_5b8 >> 0x31),
                        CONCAT24(uStack_a14 >> 1,CONCAT22(uStack_a16 >> 1,local_a18 >> 1)));
  uStack_11f0 = CONCAT26((ushort)(uStack_5b0 >> 0x31),
                         CONCAT24(uStack_a0c >> 1,CONCAT22(uStack_a0e >> 1,uStack_a10 >> 1)));
  auVar8._8_8_ = uStack_11f0;
  auVar8._0_8_ = local_11f8;
  auVar20 = paddusw(auVar20,auVar8);
  auVar14._8_8_ = lStack_1120;
  auVar14._0_8_ = local_1128;
  auVar20 = psubusw(auVar20,auVar14);
  local_1168 = auVar20._0_8_;
  uStack_1160 = auVar20._8_8_;
  local_f08 = local_1168;
  uVar3 = local_f08;
  uStack_f00 = uStack_1160;
  uVar4 = uStack_f00;
  local_f18 = 0;
  uStack_f10 = 0;
  local_f08._0_2_ = auVar20._0_2_;
  local_f08._2_2_ = auVar20._2_2_;
  local_f08._4_2_ = auVar20._4_2_;
  local_f08._6_2_ = auVar20._6_2_;
  uStack_f00._0_2_ = auVar20._8_2_;
  uStack_f00._2_2_ = auVar20._10_2_;
  uStack_f00._4_2_ = auVar20._12_2_;
  uStack_f00._6_2_ = auVar20._14_2_;
  local_f98 = CONCAT26(-(ushort)(local_f08._6_2_ == 0),
                       CONCAT24(-(ushort)(local_f08._4_2_ == 0),
                                CONCAT22(-(ushort)(local_f08._2_2_ == 0),
                                         -(ushort)((short)local_f08 == 0)))) ^ 0xffffffffffffffff;
  uStack_f90 = CONCAT26(-(ushort)(uStack_f00._6_2_ == 0),
                        CONCAT24(-(ushort)(uStack_f00._4_2_ == 0),
                                 CONCAT22(-(ushort)(uStack_f00._2_2_ == 0),
                                          -(ushort)((short)uStack_f00 == 0)))) ^ 0xffffffffffffffff;
  auVar7._8_8_ = lStack_1130;
  auVar7._0_8_ = local_1138;
  auVar6._8_8_ = 0x1000100010001;
  auVar6._0_8_ = 0x1000100010001;
  local_fa8 = paddusw(auVar7,auVar6);
  uVar19 = local_f98 & local_fa8._0_8_;
  uVar33 = uStack_f90 & local_fa8._8_8_;
  auVar44 = psubusw(*local_10a0,*local_10b0);
  auVar20 = psubusw(*local_10b0,*local_10a0);
  local_5f8 = auVar44._0_8_;
  uStack_5f0 = auVar44._8_8_;
  local_608 = auVar20._0_8_;
  uStack_600 = auVar20._8_8_;
  local_5f8 = local_5f8 | local_608;
  uStack_5f0 = uStack_5f0 | uStack_600;
  auVar44 = psubusw(*local_10b0,*local_10c0);
  auVar20 = psubusw(*local_10c0,*local_10b0);
  local_638 = auVar44._0_8_;
  uStack_630 = auVar44._8_8_;
  local_648 = auVar20._0_8_;
  uStack_640 = auVar20._8_8_;
  local_638 = local_638 | local_648;
  uStack_630 = uStack_630 | uStack_640;
  local_58 = (short)local_5f8;
  sStack_56 = (short)(local_5f8 >> 0x10);
  sStack_54 = (short)(local_5f8 >> 0x20);
  sStack_52 = (short)(local_5f8 >> 0x30);
  sStack_50 = (short)uStack_5f0;
  sStack_4e = (short)(uStack_5f0 >> 0x10);
  sStack_4c = (short)(uStack_5f0 >> 0x20);
  sStack_4a = (short)(uStack_5f0 >> 0x30);
  local_68 = (short)local_638;
  sStack_66 = (short)(local_638 >> 0x10);
  sStack_64 = (short)(local_638 >> 0x20);
  sStack_62 = (short)(local_638 >> 0x30);
  sStack_60 = (short)uStack_630;
  sStack_5e = (short)(uStack_630 >> 0x10);
  sStack_5c = (short)(uStack_630 >> 0x20);
  sStack_5a = (short)(uStack_630 >> 0x30);
  uVar17 = (ushort)(local_58 < local_68) * local_68 | (ushort)(local_58 >= local_68) * local_58;
  uVar21 = (ushort)(sStack_56 < sStack_66) * sStack_66 |
           (ushort)(sStack_56 >= sStack_66) * sStack_56;
  uVar24 = (ushort)(sStack_54 < sStack_64) * sStack_64 |
           (ushort)(sStack_54 >= sStack_64) * sStack_54;
  uVar27 = (ushort)(sStack_52 < sStack_62) * sStack_62 |
           (ushort)(sStack_52 >= sStack_62) * sStack_52;
  uVar30 = (ushort)(sStack_50 < sStack_60) * sStack_60 |
           (ushort)(sStack_50 >= sStack_60) * sStack_50;
  uVar34 = (ushort)(sStack_4e < sStack_5e) * sStack_5e |
           (ushort)(sStack_4e >= sStack_5e) * sStack_4e;
  uVar37 = (ushort)(sStack_4c < sStack_5c) * sStack_5c |
           (ushort)(sStack_4c >= sStack_5c) * sStack_4c;
  uVar40 = (ushort)(sStack_4a < sStack_5a) * sStack_5a |
           (ushort)(sStack_4a >= sStack_5a) * sStack_4a;
  auVar44 = psubusw(*local_10c0,*local_10d0);
  auVar20 = psubusw(*local_10d0,*local_10c0);
  local_678 = auVar44._0_8_;
  uStack_670 = auVar44._8_8_;
  local_688 = auVar20._0_8_;
  uStack_680 = auVar20._8_8_;
  local_678 = local_678 | local_688;
  uStack_670 = uStack_670 | uStack_680;
  auVar44 = psubusw(*local_10c8,*local_10d8);
  auVar20 = psubusw(*local_10d8,*local_10c8);
  local_6b8 = auVar44._0_8_;
  uStack_6b0 = auVar44._8_8_;
  local_6c8 = auVar20._0_8_;
  uStack_6c0 = auVar20._8_8_;
  local_6b8 = local_6b8 | local_6c8;
  uStack_6b0 = uStack_6b0 | uStack_6c0;
  local_78 = (short)local_678;
  sStack_76 = (short)(local_678 >> 0x10);
  sStack_74 = (short)(local_678 >> 0x20);
  sStack_72 = (short)(local_678 >> 0x30);
  sStack_70 = (short)uStack_670;
  sStack_6e = (short)(uStack_670 >> 0x10);
  sStack_6c = (short)(uStack_670 >> 0x20);
  sStack_6a = (short)(uStack_670 >> 0x30);
  local_88 = (short)local_6b8;
  sStack_86 = (short)(local_6b8 >> 0x10);
  sStack_84 = (short)(local_6b8 >> 0x20);
  sStack_82 = (short)(local_6b8 >> 0x30);
  sStack_80 = (short)uStack_6b0;
  sStack_7e = (short)(uStack_6b0 >> 0x10);
  sStack_7c = (short)(uStack_6b0 >> 0x20);
  sStack_7a = (short)(uStack_6b0 >> 0x30);
  uVar18 = (ushort)(local_78 < local_88) * local_88 | (ushort)(local_78 >= local_88) * local_78;
  uVar22 = (ushort)(sStack_76 < sStack_86) * sStack_86 |
           (ushort)(sStack_76 >= sStack_86) * sStack_76;
  uVar25 = (ushort)(sStack_74 < sStack_84) * sStack_84 |
           (ushort)(sStack_74 >= sStack_84) * sStack_74;
  uVar28 = (ushort)(sStack_72 < sStack_82) * sStack_82 |
           (ushort)(sStack_72 >= sStack_82) * sStack_72;
  uVar31 = (ushort)(sStack_70 < sStack_80) * sStack_80 |
           (ushort)(sStack_70 >= sStack_80) * sStack_70;
  uVar35 = (ushort)(sStack_6e < sStack_7e) * sStack_7e |
           (ushort)(sStack_6e >= sStack_7e) * sStack_6e;
  uVar38 = (ushort)(sStack_6c < sStack_7c) * sStack_7c |
           (ushort)(sStack_6c >= sStack_7c) * sStack_6c;
  uVar41 = (ushort)(sStack_6a < sStack_7a) * sStack_7a |
           (ushort)(sStack_6a >= sStack_7a) * sStack_6a;
  uVar17 = ((short)uVar17 < (short)uVar18) * uVar18 | ((short)uVar17 >= (short)uVar18) * uVar17;
  uVar23 = ((short)uVar21 < (short)uVar22) * uVar22 | ((short)uVar21 >= (short)uVar22) * uVar21;
  uVar26 = ((short)uVar24 < (short)uVar25) * uVar25 | ((short)uVar24 >= (short)uVar25) * uVar24;
  uVar29 = ((short)uVar27 < (short)uVar28) * uVar28 | ((short)uVar27 >= (short)uVar28) * uVar27;
  uVar32 = ((short)uVar30 < (short)uVar31) * uVar31 | ((short)uVar30 >= (short)uVar31) * uVar30;
  uVar36 = ((short)uVar34 < (short)uVar35) * uVar35 | ((short)uVar34 >= (short)uVar35) * uVar34;
  uVar39 = ((short)uVar37 < (short)uVar38) * uVar38 | ((short)uVar37 >= (short)uVar38) * uVar37;
  uVar42 = ((short)uVar40 < (short)uVar41) * uVar41 | ((short)uVar40 >= (short)uVar41) * uVar40;
  auVar44 = psubusw(*local_10b8,*local_10c8);
  auVar20 = psubusw(*local_10c8,*local_10b8);
  local_6f8 = auVar44._0_8_;
  uStack_6f0 = auVar44._8_8_;
  local_708 = auVar20._0_8_;
  uStack_700 = auVar20._8_8_;
  local_6f8 = local_6f8 | local_708;
  uStack_6f0 = uStack_6f0 | uStack_700;
  auVar44 = psubusw(*local_10b8,*local_10a8);
  auVar20 = psubusw(*local_10a8,*local_10b8);
  local_738 = auVar44._0_8_;
  uStack_730 = auVar44._8_8_;
  local_748 = auVar20._0_8_;
  uStack_740 = auVar20._8_8_;
  local_738 = local_738 | local_748;
  uStack_730 = uStack_730 | uStack_740;
  local_b8 = (short)local_6f8;
  sStack_b6 = (short)(local_6f8 >> 0x10);
  sStack_b4 = (short)(local_6f8 >> 0x20);
  sStack_b2 = (short)(local_6f8 >> 0x30);
  sStack_b0 = (short)uStack_6f0;
  sStack_ae = (short)(uStack_6f0 >> 0x10);
  sStack_ac = (short)(uStack_6f0 >> 0x20);
  sStack_aa = (short)(uStack_6f0 >> 0x30);
  local_c8 = (short)local_738;
  sStack_c6 = (short)(local_738 >> 0x10);
  sStack_c4 = (short)(local_738 >> 0x20);
  sStack_c2 = (short)(local_738 >> 0x30);
  sStack_c0 = (short)uStack_730;
  sStack_be = (short)(uStack_730 >> 0x10);
  sStack_bc = (short)(uStack_730 >> 0x20);
  sStack_ba = (short)(uStack_730 >> 0x30);
  uVar21 = (ushort)(local_b8 < local_c8) * local_c8 | (ushort)(local_b8 >= local_c8) * local_b8;
  uVar24 = (ushort)(sStack_b6 < sStack_c6) * sStack_c6 |
           (ushort)(sStack_b6 >= sStack_c6) * sStack_b6;
  uVar27 = (ushort)(sStack_b4 < sStack_c4) * sStack_c4 |
           (ushort)(sStack_b4 >= sStack_c4) * sStack_b4;
  uVar30 = (ushort)(sStack_b2 < sStack_c2) * sStack_c2 |
           (ushort)(sStack_b2 >= sStack_c2) * sStack_b2;
  uVar34 = (ushort)(sStack_b0 < sStack_c0) * sStack_c0 |
           (ushort)(sStack_b0 >= sStack_c0) * sStack_b0;
  uVar37 = (ushort)(sStack_ae < sStack_be) * sStack_be |
           (ushort)(sStack_ae >= sStack_be) * sStack_ae;
  uVar40 = (ushort)(sStack_ac < sStack_bc) * sStack_bc |
           (ushort)(sStack_ac >= sStack_bc) * sStack_ac;
  uVar43 = (ushort)(sStack_aa < sStack_ba) * sStack_ba |
           (ushort)(sStack_aa >= sStack_ba) * sStack_aa;
  uVar17 = ((short)uVar21 < (short)uVar17) * uVar17 | ((short)uVar21 >= (short)uVar17) * uVar21;
  uVar21 = ((short)uVar24 < (short)uVar23) * uVar23 | ((short)uVar24 >= (short)uVar23) * uVar24;
  uVar23 = ((short)uVar27 < (short)uVar26) * uVar26 | ((short)uVar27 >= (short)uVar26) * uVar27;
  uVar24 = ((short)uVar30 < (short)uVar29) * uVar29 | ((short)uVar30 >= (short)uVar29) * uVar30;
  uVar26 = ((short)uVar34 < (short)uVar32) * uVar32 | ((short)uVar34 >= (short)uVar32) * uVar34;
  uVar27 = ((short)uVar37 < (short)uVar36) * uVar36 | ((short)uVar37 >= (short)uVar36) * uVar37;
  uVar29 = ((short)uVar40 < (short)uVar39) * uVar39 | ((short)uVar40 >= (short)uVar39) * uVar40;
  uVar30 = ((short)uVar43 < (short)uVar42) * uVar42 | ((short)uVar43 >= (short)uVar42) * uVar43;
  local_108 = (short)uVar19;
  sStack_106 = (short)(uVar19 >> 0x10);
  sStack_104 = (short)(uVar19 >> 0x20);
  sStack_102 = (short)(uVar19 >> 0x30);
  sStack_100 = (short)uVar33;
  sStack_fe = (short)(uVar33 >> 0x10);
  sStack_fc = (short)(uVar33 >> 0x20);
  sStack_fa = (short)(uVar33 >> 0x30);
  local_1168._0_4_ =
       CONCAT22((ushort)((short)uVar21 < sStack_106) * sStack_106 |
                ((short)uVar21 >= sStack_106) * uVar21,
                (ushort)((short)uVar17 < local_108) * local_108 |
                ((short)uVar17 >= local_108) * uVar17);
  local_1168._0_6_ =
       CONCAT24((ushort)((short)uVar23 < sStack_104) * sStack_104 |
                ((short)uVar23 >= sStack_104) * uVar23,(undefined4)local_1168);
  local_1168 = CONCAT26((ushort)((short)uVar24 < sStack_102) * sStack_102 |
                        ((short)uVar24 >= sStack_102) * uVar24,(undefined6)local_1168);
  uStack_1160._0_2_ =
       (ushort)((short)uVar26 < sStack_100) * sStack_100 | ((short)uVar26 >= sStack_100) * uVar26;
  uStack_1160._2_2_ =
       (ushort)((short)uVar27 < sStack_fe) * sStack_fe | ((short)uVar27 >= sStack_fe) * uVar27;
  uStack_1160._4_2_ =
       (ushort)((short)uVar29 < sStack_fc) * sStack_fc | ((short)uVar29 >= sStack_fc) * uVar29;
  uStack_1160._6_2_ =
       (ushort)((short)uVar30 < sStack_fa) * sStack_fa | ((short)uVar30 >= sStack_fa) * uVar30;
  auVar13._8_8_ = uStack_1160;
  auVar13._0_8_ = local_1168;
  auVar12._8_8_ = lStack_1130;
  auVar12._0_8_ = local_1138;
  auVar20 = psubusw(auVar13,auVar12);
  local_1168 = auVar20._0_8_;
  uStack_1160 = auVar20._8_8_;
  local_f28 = local_1168;
  uVar1 = local_f28;
  uStack_f20 = uStack_1160;
  uVar2 = uStack_f20;
  local_f38 = 0;
  uStack_f30 = 0;
  local_f28._0_2_ = auVar20._0_2_;
  local_f28._2_2_ = auVar20._2_2_;
  local_f28._4_2_ = auVar20._4_2_;
  local_f28._6_2_ = auVar20._6_2_;
  uStack_f20._0_2_ = auVar20._8_2_;
  uStack_f20._2_2_ = auVar20._10_2_;
  uStack_f20._4_2_ = auVar20._12_2_;
  uStack_f20._6_2_ = auVar20._14_2_;
  local_1168._0_4_ = CONCAT22(-(ushort)(local_f28._2_2_ == 0),-(ushort)((short)local_f28 == 0));
  local_1168._0_6_ = CONCAT24(-(ushort)(local_f28._4_2_ == 0),(undefined4)local_1168);
  local_1168 = CONCAT26(-(ushort)(local_f28._6_2_ == 0),(undefined6)local_1168);
  uStack_1160._0_2_ = -(ushort)((short)uStack_f20 == 0);
  uStack_1160._2_2_ = -(ushort)(uStack_f20._2_2_ == 0);
  uStack_1160._4_2_ = -(ushort)(uStack_f20._4_2_ == 0);
  uStack_1160._6_2_ = -(ushort)(uStack_f20._6_2_ == 0);
  local_f28 = uVar1;
  uStack_f20 = uVar2;
  local_f08 = uVar3;
  uStack_f00 = uVar4;
  highbd_filter4_dual_sse2
            (in_RCX,in_R8,in_R9,qs_00,mask_00,th,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4c8
            );
  auVar44 = psubusw(*local_10b0,*local_10d0);
  auVar20 = psubusw(*local_10d0,*local_10b0);
  local_778 = auVar44._0_8_;
  uStack_770 = auVar44._8_8_;
  local_788 = auVar20._0_8_;
  uStack_780 = auVar20._8_8_;
  local_778 = local_778 | local_788;
  uStack_770 = uStack_770 | uStack_780;
  auVar44 = psubusw(*local_10b8,*local_10d8);
  auVar20 = psubusw(*local_10d8,*local_10b8);
  local_7b8 = auVar44._0_8_;
  uStack_7b0 = auVar44._8_8_;
  local_7c8 = auVar20._0_8_;
  uStack_7c0 = auVar20._8_8_;
  local_7b8 = local_7b8 | local_7c8;
  uStack_7b0 = uStack_7b0 | uStack_7c0;
  local_118 = (short)local_778;
  sStack_116 = (short)(local_778 >> 0x10);
  sStack_114 = (short)(local_778 >> 0x20);
  sStack_112 = (short)(local_778 >> 0x30);
  sStack_110 = (short)uStack_770;
  sStack_10e = (short)(uStack_770 >> 0x10);
  sStack_10c = (short)(uStack_770 >> 0x20);
  sStack_10a = (short)(uStack_770 >> 0x30);
  local_128 = (short)local_7b8;
  sStack_126 = (short)(local_7b8 >> 0x10);
  sStack_124 = (short)(local_7b8 >> 0x20);
  sStack_122 = (short)(local_7b8 >> 0x30);
  sStack_120 = (short)uStack_7b0;
  sStack_11e = (short)(uStack_7b0 >> 0x10);
  sStack_11c = (short)(uStack_7b0 >> 0x20);
  sStack_11a = (short)(uStack_7b0 >> 0x30);
  uVar17 = (ushort)(local_118 < local_128) * local_128 |
           (ushort)(local_118 >= local_128) * local_118;
  uVar21 = (ushort)(sStack_116 < sStack_126) * sStack_126 |
           (ushort)(sStack_116 >= sStack_126) * sStack_116;
  uVar23 = (ushort)(sStack_114 < sStack_124) * sStack_124 |
           (ushort)(sStack_114 >= sStack_124) * sStack_114;
  uVar24 = (ushort)(sStack_112 < sStack_122) * sStack_122 |
           (ushort)(sStack_112 >= sStack_122) * sStack_112;
  uVar26 = (ushort)(sStack_110 < sStack_120) * sStack_120 |
           (ushort)(sStack_110 >= sStack_120) * sStack_110;
  uVar29 = (ushort)(sStack_10e < sStack_11e) * sStack_11e |
           (ushort)(sStack_10e >= sStack_11e) * sStack_10e;
  uVar30 = (ushort)(sStack_10c < sStack_11c) * sStack_11c |
           (ushort)(sStack_10c >= sStack_11c) * sStack_10c;
  uVar32 = (ushort)(sStack_10a < sStack_11a) * sStack_11a |
           (ushort)(sStack_10a >= sStack_11a) * sStack_10a;
  uVar17 = ((short)uVar18 < (short)uVar17) * uVar17 | ((short)uVar18 >= (short)uVar17) * uVar18;
  uVar21 = ((short)uVar22 < (short)uVar21) * uVar21 | ((short)uVar22 >= (short)uVar21) * uVar22;
  uVar23 = ((short)uVar25 < (short)uVar23) * uVar23 | ((short)uVar25 >= (short)uVar23) * uVar25;
  uVar25 = ((short)uVar28 < (short)uVar24) * uVar24 | ((short)uVar28 >= (short)uVar24) * uVar28;
  uVar27 = ((short)uVar31 < (short)uVar26) * uVar26 | ((short)uVar31 >= (short)uVar26) * uVar31;
  uVar29 = ((short)uVar35 < (short)uVar29) * uVar29 | ((short)uVar35 >= (short)uVar29) * uVar35;
  uVar31 = ((short)uVar38 < (short)uVar30) * uVar30 | ((short)uVar38 >= (short)uVar30) * uVar38;
  uVar34 = ((short)uVar41 < (short)uVar32) * uVar32 | ((short)uVar41 >= (short)uVar32) * uVar41;
  auVar44 = psubusw(*local_10a0,*local_10d0);
  auVar20 = psubusw(*local_10d0,*local_10a0);
  local_7f8 = auVar44._0_8_;
  uStack_7f0 = auVar44._8_8_;
  local_808 = auVar20._0_8_;
  uStack_800 = auVar20._8_8_;
  local_7f8 = local_7f8 | local_808;
  uStack_7f0 = uStack_7f0 | uStack_800;
  auVar44 = psubusw(*local_10a8,*local_10d8);
  auVar20 = psubusw(*local_10d8,*local_10a8);
  local_838 = auVar44._0_8_;
  uStack_830 = auVar44._8_8_;
  local_848 = auVar20._0_8_;
  uStack_840 = auVar20._8_8_;
  local_838 = local_838 | local_848;
  uStack_830 = uStack_830 | uStack_840;
  local_158 = (short)local_7f8;
  sStack_156 = (short)(local_7f8 >> 0x10);
  sStack_154 = (short)(local_7f8 >> 0x20);
  sStack_152 = (short)(local_7f8 >> 0x30);
  sStack_150 = (short)uStack_7f0;
  sStack_14e = (short)(uStack_7f0 >> 0x10);
  sStack_14c = (short)(uStack_7f0 >> 0x20);
  sStack_14a = (short)(uStack_7f0 >> 0x30);
  local_168 = (short)local_838;
  sStack_166 = (short)(local_838 >> 0x10);
  sStack_164 = (short)(local_838 >> 0x20);
  sStack_162 = (short)(local_838 >> 0x30);
  sStack_160 = (short)uStack_830;
  sStack_15e = (short)(uStack_830 >> 0x10);
  sStack_15c = (short)(uStack_830 >> 0x20);
  sStack_15a = (short)(uStack_830 >> 0x30);
  uVar18 = (ushort)(local_158 < local_168) * local_168 |
           (ushort)(local_158 >= local_168) * local_158;
  uVar22 = (ushort)(sStack_156 < sStack_166) * sStack_166 |
           (ushort)(sStack_156 >= sStack_166) * sStack_156;
  uVar24 = (ushort)(sStack_154 < sStack_164) * sStack_164 |
           (ushort)(sStack_154 >= sStack_164) * sStack_154;
  uVar26 = (ushort)(sStack_152 < sStack_162) * sStack_162 |
           (ushort)(sStack_152 >= sStack_162) * sStack_152;
  uVar28 = (ushort)(sStack_150 < sStack_160) * sStack_160 |
           (ushort)(sStack_150 >= sStack_160) * sStack_150;
  uVar30 = (ushort)(sStack_14e < sStack_15e) * sStack_15e |
           (ushort)(sStack_14e >= sStack_15e) * sStack_14e;
  uVar32 = (ushort)(sStack_14c < sStack_15c) * sStack_15c |
           (ushort)(sStack_14c >= sStack_15c) * sStack_14c;
  uVar35 = (ushort)(sStack_14a < sStack_15a) * sStack_15a |
           (ushort)(sStack_14a >= sStack_15a) * sStack_14a;
  local_1178._0_4_ =
       CONCAT22(((short)uVar22 < (short)uVar21) * uVar21 | ((short)uVar22 >= (short)uVar21) * uVar22
                ,((short)uVar18 < (short)uVar17) * uVar17 |
                 ((short)uVar18 >= (short)uVar17) * uVar18);
  local_1178._0_6_ =
       CONCAT24(((short)uVar24 < (short)uVar23) * uVar23 | ((short)uVar24 >= (short)uVar23) * uVar24
                ,(undefined4)local_1178);
  local_1178 = CONCAT26(((short)uVar26 < (short)uVar25) * uVar25 |
                        ((short)uVar26 >= (short)uVar25) * uVar26,(undefined6)local_1178);
  uStack_1170._0_2_ =
       ((short)uVar28 < (short)uVar27) * uVar27 | ((short)uVar28 >= (short)uVar27) * uVar28;
  uStack_1170._2_2_ =
       ((short)uVar30 < (short)uVar29) * uVar29 | ((short)uVar30 >= (short)uVar29) * uVar30;
  uStack_1170._4_2_ =
       ((short)uVar32 < (short)uVar31) * uVar31 | ((short)uVar32 >= (short)uVar31) * uVar32;
  uStack_1170._6_2_ =
       ((short)uVar35 < (short)uVar34) * uVar34 | ((short)uVar35 >= (short)uVar34) * uVar35;
  auVar44._8_8_ = 0x1000100010001;
  auVar44._0_8_ = 0x1000100010001;
  auVar20 = psllw(auVar44,ZEXT416(local_110c - 8));
  auVar11._8_8_ = uStack_1170;
  auVar11._0_8_ = local_1178;
  auVar20 = psubusw(auVar11,auVar20);
  local_f48 = auVar20._0_2_;
  sStack_f46 = auVar20._2_2_;
  sStack_f44 = auVar20._4_2_;
  sStack_f42 = auVar20._6_2_;
  sStack_f40 = auVar20._8_2_;
  sStack_f3e = auVar20._10_2_;
  sStack_f3c = auVar20._12_2_;
  sStack_f3a = auVar20._14_2_;
  local_1178._0_4_ = CONCAT22(-(ushort)(sStack_f46 == 0),-(ushort)(local_f48 == 0));
  local_1178._0_6_ = CONCAT24(-(ushort)(sStack_f44 == 0),(undefined4)local_1178);
  local_1178 = CONCAT26(-(ushort)(sStack_f42 == 0),(undefined6)local_1178);
  uStack_1170._0_2_ = -(ushort)(sStack_f40 == 0);
  uStack_1170._2_2_ = -(ushort)(sStack_f3e == 0);
  uStack_1170._4_2_ = -(ushort)(sStack_f3c == 0);
  uStack_1170._6_2_ = -(ushort)(sStack_f3a == 0);
  local_1178 = local_1178 & local_1168;
  uStack_1170 = uStack_1170 & uStack_1160;
  local_f68 = (short)local_1178;
  sStack_f66 = (short)(local_1178 >> 0x10);
  sStack_f64 = (short)(local_1178 >> 0x20);
  sStack_f62 = (short)(local_1178 >> 0x30);
  sStack_f60 = (short)uStack_1170;
  sStack_f5e = (short)(uStack_1170 >> 0x10);
  sStack_f5c = (short)(uStack_1170 >> 0x20);
  sStack_f5a = (short)(uStack_1170 >> 0x30);
  uVar17 = -(ushort)(sStack_f5a == 0);
  auVar20._2_2_ = -(ushort)(sStack_f66 == 0);
  auVar20._0_2_ = -(ushort)(local_f68 == 0);
  auVar20._4_2_ = -(ushort)(sStack_f64 == 0);
  auVar20._6_2_ = -(ushort)(sStack_f62 == 0);
  auVar20._8_2_ = -(ushort)(sStack_f60 == 0);
  auVar20._10_2_ = -(ushort)(sStack_f5e == 0);
  auVar20._12_2_ = -(ushort)(sStack_f5c == 0);
  auVar20._14_2_ = uVar17;
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uVar17 >> 7) & 1) << 0xe | uVar17 & 0x8000) == 0xffff) {
    *(ulong *)*local_10d8 = local_12b8;
    *(ulong *)(*local_10d8 + 8) = uStack_12b0;
    *(ulong *)*local_10c8 = local_12a8;
    *(ulong *)(*local_10c8 + 8) = uStack_12a0;
    *(ulong *)*local_10d0 = local_1298;
    *(ulong *)(*local_10d0 + 8) = uStack_1290;
    *(ulong *)*local_10c0 = local_1288;
    *(ulong *)(*local_10c0 + 8) = uStack_1280;
  }
  else {
    uVar1 = *(undefined8 *)*local_10a0;
    uVar2 = *(undefined8 *)(*local_10a0 + 8);
    local_bf8 = (short)uVar1;
    sStack_bf6 = (short)((ulong)uVar1 >> 0x10);
    sStack_bf4 = (short)((ulong)uVar1 >> 0x20);
    sStack_bf2 = (short)((ulong)uVar1 >> 0x30);
    sStack_bf0 = (short)uVar2;
    sStack_bee = (short)((ulong)uVar2 >> 0x10);
    sStack_bec = (short)((ulong)uVar2 >> 0x20);
    sStack_bea = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10b0;
    uVar2 = *(undefined8 *)(*local_10b0 + 8);
    uVar3 = *(undefined8 *)*local_10c0;
    uVar4 = *(undefined8 *)(*local_10c0 + 8);
    local_c18 = (short)uVar1;
    sStack_c16 = (short)((ulong)uVar1 >> 0x10);
    sStack_c14 = (short)((ulong)uVar1 >> 0x20);
    sStack_c12 = (short)((ulong)uVar1 >> 0x30);
    sStack_c10 = (short)uVar2;
    sStack_c0e = (short)((ulong)uVar2 >> 0x10);
    sStack_c0c = (short)((ulong)uVar2 >> 0x20);
    sStack_c0a = (short)((ulong)uVar2 >> 0x30);
    local_c28 = (short)uVar3;
    sStack_c26 = (short)((ulong)uVar3 >> 0x10);
    sStack_c24 = (short)((ulong)uVar3 >> 0x20);
    sStack_c22 = (short)((ulong)uVar3 >> 0x30);
    sStack_c20 = (short)uVar4;
    sStack_c1e = (short)((ulong)uVar4 >> 0x10);
    sStack_c1c = (short)((ulong)uVar4 >> 0x20);
    sStack_c1a = (short)((ulong)uVar4 >> 0x30);
    uVar1 = *(undefined8 *)*local_10d0;
    uVar2 = *(undefined8 *)(*local_10d0 + 8);
    local_c88 = (short)uVar1;
    sStack_c86 = (short)((ulong)uVar1 >> 0x10);
    sStack_c84 = (short)((ulong)uVar1 >> 0x20);
    sStack_c82 = (short)((ulong)uVar1 >> 0x30);
    sStack_c80 = (short)uVar2;
    sStack_c7e = (short)((ulong)uVar2 >> 0x10);
    sStack_c7c = (short)((ulong)uVar2 >> 0x20);
    sStack_c7a = (short)((ulong)uVar2 >> 0x30);
    local_c88 = local_bf8 * 2 + local_c18 + local_c28 + 4 + local_c88;
    sStack_c86 = sStack_bf6 * 2 + sStack_c16 + sStack_c26 + 4 + sStack_c86;
    sStack_c84 = sStack_bf4 * 2 + sStack_c14 + sStack_c24 + 4 + sStack_c84;
    sStack_c82 = sStack_bf2 * 2 + sStack_c12 + sStack_c22 + 4 + sStack_c82;
    sStack_c80 = sStack_bf0 * 2 + sStack_c10 + sStack_c20 + 4 + sStack_c80;
    sStack_c7e = sStack_bee * 2 + sStack_c0e + sStack_c1e + 4 + sStack_c7e;
    sStack_c7c = sStack_bec * 2 + sStack_c0c + sStack_c1c + 4 + sStack_c7c;
    sStack_c7a = sStack_bea * 2 + sStack_c0a + sStack_c1a + 4 + sStack_c7a;
    uVar1 = *(undefined8 *)*local_10d8;
    uVar2 = *(undefined8 *)(*local_10d8 + 8);
    uVar3 = *(undefined8 *)*local_10b0;
    uVar4 = *(undefined8 *)(*local_10b0 + 8);
    local_c98 = (short)uVar1;
    sStack_c96 = (short)((ulong)uVar1 >> 0x10);
    sStack_c94 = (short)((ulong)uVar1 >> 0x20);
    sStack_c92 = (short)((ulong)uVar1 >> 0x30);
    sStack_c90 = (short)uVar2;
    sStack_c8e = (short)((ulong)uVar2 >> 0x10);
    sStack_c8c = (short)((ulong)uVar2 >> 0x20);
    sStack_c8a = (short)((ulong)uVar2 >> 0x30);
    local_ca8 = (short)uVar3;
    sStack_ca6 = (short)((ulong)uVar3 >> 0x10);
    sStack_ca4 = (short)((ulong)uVar3 >> 0x20);
    sStack_ca2 = (short)((ulong)uVar3 >> 0x30);
    sStack_ca0 = (short)uVar4;
    sStack_c9e = (short)((ulong)uVar4 >> 0x10);
    sStack_c9c = (short)((ulong)uVar4 >> 0x20);
    sStack_c9a = (short)((ulong)uVar4 >> 0x30);
    uVar1 = *(undefined8 *)*local_10a0;
    uVar2 = *(undefined8 *)(*local_10a0 + 8);
    local_cc8 = (short)uVar1;
    sStack_cc6 = (short)((ulong)uVar1 >> 0x10);
    sStack_cc4 = (short)((ulong)uVar1 >> 0x20);
    sStack_cc2 = (short)((ulong)uVar1 >> 0x30);
    sStack_cc0 = (short)uVar2;
    sStack_cbe = (short)((ulong)uVar2 >> 0x10);
    sStack_cbc = (short)((ulong)uVar2 >> 0x20);
    sStack_cba = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10d8;
    uVar2 = *(undefined8 *)(*local_10d8 + 8);
    uVar3 = *(undefined8 *)*local_10c8;
    uVar4 = *(undefined8 *)(*local_10c8 + 8);
    local_cf8 = (short)uVar1;
    sStack_cf6 = (short)((ulong)uVar1 >> 0x10);
    sStack_cf4 = (short)((ulong)uVar1 >> 0x20);
    sStack_cf2 = (short)((ulong)uVar1 >> 0x30);
    sStack_cf0 = (short)uVar2;
    sStack_cee = (short)((ulong)uVar2 >> 0x10);
    sStack_cec = (short)((ulong)uVar2 >> 0x20);
    sStack_cea = (short)((ulong)uVar2 >> 0x30);
    local_d08 = (short)uVar3;
    sStack_d06 = (short)((ulong)uVar3 >> 0x10);
    sStack_d04 = (short)((ulong)uVar3 >> 0x20);
    sStack_d02 = (short)((ulong)uVar3 >> 0x30);
    sStack_d00 = (short)uVar4;
    sStack_cfe = (short)((ulong)uVar4 >> 0x10);
    sStack_cfc = (short)((ulong)uVar4 >> 0x20);
    sStack_cfa = (short)((ulong)uVar4 >> 0x30);
    uVar1 = *(undefined8 *)*local_10c0;
    uVar2 = *(undefined8 *)(*local_10c0 + 8);
    local_d28 = (short)uVar1;
    sStack_d26 = (short)((ulong)uVar1 >> 0x10);
    sStack_d24 = (short)((ulong)uVar1 >> 0x20);
    sStack_d22 = (short)((ulong)uVar1 >> 0x30);
    sStack_d20 = (short)uVar2;
    sStack_d1e = (short)((ulong)uVar2 >> 0x10);
    sStack_d1c = (short)((ulong)uVar2 >> 0x20);
    sStack_d1a = (short)((ulong)uVar2 >> 0x30);
    local_d28 = local_cf8 + local_d08 + local_d28;
    sStack_d26 = sStack_cf6 + sStack_d06 + sStack_d26;
    sStack_d24 = sStack_cf4 + sStack_d04 + sStack_d24;
    sStack_d22 = sStack_cf2 + sStack_d02 + sStack_d22;
    sStack_d20 = sStack_cf0 + sStack_d00 + sStack_d20;
    sStack_d1e = sStack_cee + sStack_cfe + sStack_d1e;
    sStack_d1c = sStack_cec + sStack_cfc + sStack_d1c;
    sStack_d1a = sStack_cea + sStack_cfa + sStack_d1a;
    local_11b8 = CONCAT26((ushort)(sStack_c82 + sStack_d22) >> 3,
                          CONCAT24((ushort)(sStack_c84 + sStack_d24) >> 3,
                                   CONCAT22((ushort)(sStack_c86 + sStack_d26) >> 3,
                                            (ushort)(local_c88 + local_d28) >> 3)));
    uStack_11b0 = CONCAT26((ushort)(sStack_c7a + sStack_d1a) >> 3,
                           CONCAT24((ushort)(sStack_c7c + sStack_d1c) >> 3,
                                    CONCAT22((ushort)(sStack_c7e + sStack_d1e) >> 3,
                                             (ushort)(sStack_c80 + sStack_d20) >> 3)));
    uVar1 = *(undefined8 *)*local_10a0;
    uVar2 = *(undefined8 *)(*local_10a0 + 8);
    local_b08 = (short)uVar1;
    sStack_b06 = (short)((ulong)uVar1 >> 0x10);
    sStack_b04 = (short)((ulong)uVar1 >> 0x20);
    sStack_b02 = (short)((ulong)uVar1 >> 0x30);
    sStack_b00 = (short)uVar2;
    sStack_afe = (short)((ulong)uVar2 >> 0x10);
    sStack_afc = (short)((ulong)uVar2 >> 0x20);
    sStack_afa = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10b8;
    uVar2 = *(undefined8 *)(*local_10b8 + 8);
    local_d68 = (short)uVar1;
    sStack_d66 = (short)((ulong)uVar1 >> 0x10);
    sStack_d64 = (short)((ulong)uVar1 >> 0x20);
    sStack_d62 = (short)((ulong)uVar1 >> 0x30);
    sStack_d60 = (short)uVar2;
    sStack_d5e = (short)((ulong)uVar2 >> 0x10);
    sStack_d5c = (short)((ulong)uVar2 >> 0x20);
    sStack_d5a = (short)((ulong)uVar2 >> 0x30);
    local_d68 = (local_c88 - local_b08) + local_d68;
    sStack_d66 = (sStack_c86 - sStack_b06) + sStack_d66;
    sStack_d64 = (sStack_c84 - sStack_b04) + sStack_d64;
    sStack_d62 = (sStack_c82 - sStack_b02) + sStack_d62;
    sStack_d60 = (sStack_c80 - sStack_b00) + sStack_d60;
    sStack_d5e = (sStack_c7e - sStack_afe) + sStack_d5e;
    sStack_d5c = (sStack_c7c - sStack_afc) + sStack_d5c;
    sStack_d5a = (sStack_c7a - sStack_afa) + sStack_d5a;
    uVar1 = *(undefined8 *)*local_10c0;
    uVar2 = *(undefined8 *)(*local_10c0 + 8);
    local_b28 = (short)uVar1;
    sStack_b26 = (short)((ulong)uVar1 >> 0x10);
    sStack_b24 = (short)((ulong)uVar1 >> 0x20);
    sStack_b22 = (short)((ulong)uVar1 >> 0x30);
    sStack_b20 = (short)uVar2;
    sStack_b1e = (short)((ulong)uVar2 >> 0x10);
    sStack_b1c = (short)((ulong)uVar2 >> 0x20);
    sStack_b1a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10d0;
    uVar2 = *(undefined8 *)(*local_10d0 + 8);
    local_d88 = (short)uVar1;
    sStack_d86 = (short)((ulong)uVar1 >> 0x10);
    sStack_d84 = (short)((ulong)uVar1 >> 0x20);
    sStack_d82 = (short)((ulong)uVar1 >> 0x30);
    sStack_d80 = (short)uVar2;
    sStack_d7e = (short)((ulong)uVar2 >> 0x10);
    sStack_d7c = (short)((ulong)uVar2 >> 0x20);
    sStack_d7a = (short)((ulong)uVar2 >> 0x30);
    local_d88 = (local_d28 - local_b28) + local_d88;
    sStack_d86 = (sStack_d26 - sStack_b26) + sStack_d86;
    sStack_d84 = (sStack_d24 - sStack_b24) + sStack_d84;
    sStack_d82 = (sStack_d22 - sStack_b22) + sStack_d82;
    sStack_d80 = (sStack_d20 - sStack_b20) + sStack_d80;
    sStack_d7e = (sStack_d1e - sStack_b1e) + sStack_d7e;
    sStack_d7c = (sStack_d1c - sStack_b1c) + sStack_d7c;
    sStack_d7a = (sStack_d1a - sStack_b1a) + sStack_d7a;
    local_11c8 = CONCAT26((ushort)(sStack_d62 + sStack_d82) >> 3,
                          CONCAT24((ushort)(sStack_d64 + sStack_d84) >> 3,
                                   CONCAT22((ushort)(sStack_d66 + sStack_d86) >> 3,
                                            (ushort)(local_d68 + local_d88) >> 3)));
    uStack_11c0 = CONCAT26((ushort)(sStack_d5a + sStack_d7a) >> 3,
                           CONCAT24((ushort)(sStack_d5c + sStack_d7c) >> 3,
                                    CONCAT22((ushort)(sStack_d5e + sStack_d7e) >> 3,
                                             (ushort)(sStack_d60 + sStack_d80) >> 3)));
    uVar1 = *(undefined8 *)*local_10a0;
    uVar2 = *(undefined8 *)(*local_10a0 + 8);
    local_b48 = (short)uVar1;
    sStack_b46 = (short)((ulong)uVar1 >> 0x10);
    sStack_b44 = (short)((ulong)uVar1 >> 0x20);
    sStack_b42 = (short)((ulong)uVar1 >> 0x30);
    sStack_b3c = (short)((ulong)uVar2 >> 0x20);
    sStack_b3a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10a8;
    uVar3 = *(undefined8 *)(*local_10a8 + 8);
    local_dc8 = (short)uVar1;
    sStack_dc6 = (short)((ulong)uVar1 >> 0x10);
    sStack_dc4 = (short)((ulong)uVar1 >> 0x20);
    sStack_dc2 = (short)((ulong)uVar1 >> 0x30);
    sStack_dc0 = (short)uVar3;
    sStack_dbe = (short)((ulong)uVar3 >> 0x10);
    sStack_dbc = (short)((ulong)uVar3 >> 0x20);
    sStack_dba = (short)((ulong)uVar3 >> 0x30);
    local_dc8 = (local_d68 - local_b48) + local_dc8;
    sStack_dc6 = (sStack_d66 - sStack_b46) + sStack_dc6;
    sStack_dc4 = (sStack_d64 - sStack_b44) + sStack_dc4;
    sStack_dc2 = (sStack_d62 - sStack_b42) + sStack_dc2;
    sStack_dc0 = (sStack_d60 - (short)uVar2) + sStack_dc0;
    sStack_dbe = (sStack_d5e - (short)((ulong)uVar2 >> 0x10)) + sStack_dbe;
    sStack_dbc = (sStack_d5c - sStack_b3c) + sStack_dbc;
    sStack_dba = (sStack_d5a - sStack_b3a) + sStack_dba;
    uVar1 = *(undefined8 *)*local_10d0;
    uVar2 = *(undefined8 *)(*local_10d0 + 8);
    local_b68 = (short)uVar1;
    sStack_b66 = (short)((ulong)uVar1 >> 0x10);
    sStack_b64 = (short)((ulong)uVar1 >> 0x20);
    sStack_b62 = (short)((ulong)uVar1 >> 0x30);
    sStack_b60 = (short)uVar2;
    sStack_b5e = (short)((ulong)uVar2 >> 0x10);
    sStack_b5c = (short)((ulong)uVar2 >> 0x20);
    sStack_b5a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10d8;
    uVar2 = *(undefined8 *)(*local_10d8 + 8);
    local_de8 = (short)uVar1;
    sStack_de6 = (short)((ulong)uVar1 >> 0x10);
    sStack_de4 = (short)((ulong)uVar1 >> 0x20);
    sStack_de2 = (short)((ulong)uVar1 >> 0x30);
    sStack_de0 = (short)uVar2;
    sStack_dde = (short)((ulong)uVar2 >> 0x10);
    sStack_ddc = (short)((ulong)uVar2 >> 0x20);
    sStack_dda = (short)((ulong)uVar2 >> 0x30);
    local_de8 = (local_d88 - local_b68) + local_de8;
    sStack_de6 = (sStack_d86 - sStack_b66) + sStack_de6;
    sStack_de4 = (sStack_d84 - sStack_b64) + sStack_de4;
    sStack_de2 = (sStack_d82 - sStack_b62) + sStack_de2;
    sStack_de0 = (sStack_d80 - sStack_b60) + sStack_de0;
    sStack_dde = (sStack_d7e - sStack_b5e) + sStack_dde;
    sStack_ddc = (sStack_d7c - sStack_b5c) + sStack_ddc;
    sStack_dda = (sStack_d7a - sStack_b5a) + sStack_dda;
    local_11d8 = CONCAT26((ushort)(sStack_dc2 + sStack_de2) >> 3,
                          CONCAT24((ushort)(sStack_dc4 + sStack_de4) >> 3,
                                   CONCAT22((ushort)(sStack_dc6 + sStack_de6) >> 3,
                                            (ushort)(local_dc8 + local_de8) >> 3)));
    uStack_11d0 = CONCAT26((ushort)(sStack_dba + sStack_dda) >> 3,
                           CONCAT24((ushort)(sStack_dbc + sStack_ddc) >> 3,
                                    CONCAT22((ushort)(sStack_dbe + sStack_dde) >> 3,
                                             (ushort)(sStack_dc0 + sStack_de0) >> 3)));
    uVar1 = *(undefined8 *)*local_10b0;
    uVar2 = *(undefined8 *)(*local_10b0 + 8);
    local_b88 = (short)uVar1;
    sStack_b86 = (short)((ulong)uVar1 >> 0x10);
    sStack_b84 = (short)((ulong)uVar1 >> 0x20);
    sStack_b82 = (short)((ulong)uVar1 >> 0x30);
    sStack_b80 = (short)uVar2;
    sStack_b7e = (short)((ulong)uVar2 >> 0x10);
    sStack_b7c = (short)((ulong)uVar2 >> 0x20);
    sStack_b7a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10a8;
    uVar2 = *(undefined8 *)(*local_10a8 + 8);
    local_e28 = (short)uVar1;
    sStack_e26 = (short)((ulong)uVar1 >> 0x10);
    sStack_e24 = (short)((ulong)uVar1 >> 0x20);
    sStack_e22 = (short)((ulong)uVar1 >> 0x30);
    sStack_e20 = (short)uVar2;
    sStack_e1e = (short)((ulong)uVar2 >> 0x10);
    sStack_e1c = (short)((ulong)uVar2 >> 0x20);
    sStack_e1a = (short)((ulong)uVar2 >> 0x30);
    local_e28 = (local_dc8 - local_b88) + local_e28;
    sStack_e26 = (sStack_dc6 - sStack_b86) + sStack_e26;
    sStack_e24 = (sStack_dc4 - sStack_b84) + sStack_e24;
    sStack_e22 = (sStack_dc2 - sStack_b82) + sStack_e22;
    sStack_e20 = (sStack_dc0 - sStack_b80) + sStack_e20;
    sStack_e1e = (sStack_dbe - sStack_b7e) + sStack_e1e;
    sStack_e1c = (sStack_dbc - sStack_b7c) + sStack_e1c;
    sStack_e1a = (sStack_dba - sStack_b7a) + sStack_e1a;
    uVar1 = *(undefined8 *)*local_10d8;
    uVar2 = *(undefined8 *)(*local_10d8 + 8);
    local_ba8 = (short)uVar1;
    sStack_ba6 = (short)((ulong)uVar1 >> 0x10);
    sStack_ba4 = (short)((ulong)uVar1 >> 0x20);
    sStack_ba2 = (short)((ulong)uVar1 >> 0x30);
    sStack_ba0 = (short)uVar2;
    sStack_b9e = (short)((ulong)uVar2 >> 0x10);
    sStack_b9c = (short)((ulong)uVar2 >> 0x20);
    sStack_b9a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10c8;
    uVar2 = *(undefined8 *)(*local_10c8 + 8);
    local_e48 = (short)uVar1;
    sStack_e46 = (short)((ulong)uVar1 >> 0x10);
    sStack_e44 = (short)((ulong)uVar1 >> 0x20);
    sStack_e42 = (short)((ulong)uVar1 >> 0x30);
    sStack_e40 = (short)uVar2;
    sStack_e3e = (short)((ulong)uVar2 >> 0x10);
    sStack_e3c = (short)((ulong)uVar2 >> 0x20);
    sStack_e3a = (short)((ulong)uVar2 >> 0x30);
    local_e48 = (local_de8 - local_ba8) + local_e48;
    sStack_e46 = (sStack_de6 - sStack_ba6) + sStack_e46;
    sStack_e44 = (sStack_de4 - sStack_ba4) + sStack_e44;
    sStack_e42 = (sStack_de2 - sStack_ba2) + sStack_e42;
    sStack_e40 = (sStack_de0 - sStack_ba0) + sStack_e40;
    sStack_e3e = (sStack_dde - sStack_b9e) + sStack_e3e;
    sStack_e3c = (sStack_ddc - sStack_b9c) + sStack_e3c;
    sStack_e3a = (sStack_dda - sStack_b9a) + sStack_e3a;
    local_11e8 = CONCAT26((ushort)(sStack_e22 + sStack_e42) >> 3,
                          CONCAT24((ushort)(sStack_e24 + sStack_e44) >> 3,
                                   CONCAT22((ushort)(sStack_e26 + sStack_e46) >> 3,
                                            (ushort)(local_e28 + local_e48) >> 3)));
    uStack_11e0 = CONCAT26((ushort)(sStack_e1a + sStack_e3a) >> 3,
                           CONCAT24((ushort)(sStack_e1c + sStack_e3c) >> 3,
                                    CONCAT22((ushort)(sStack_e1e + sStack_e3e) >> 3,
                                             (ushort)(sStack_e20 + sStack_e40) >> 3)));
    uVar1 = *(undefined8 *)*local_10c0;
    uVar2 = *(undefined8 *)(*local_10c0 + 8);
    local_bc8 = (short)uVar1;
    sStack_bc6 = (short)((ulong)uVar1 >> 0x10);
    sStack_bc4 = (short)((ulong)uVar1 >> 0x20);
    sStack_bc2 = (short)((ulong)uVar1 >> 0x30);
    sStack_bc0 = (short)uVar2;
    sStack_bbe = (short)((ulong)uVar2 >> 0x10);
    sStack_bbc = (short)((ulong)uVar2 >> 0x20);
    sStack_bba = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10a8;
    uVar2 = *(undefined8 *)(*local_10a8 + 8);
    local_e88 = (short)uVar1;
    sStack_e86 = (short)((ulong)uVar1 >> 0x10);
    sStack_e84 = (short)((ulong)uVar1 >> 0x20);
    sStack_e82 = (short)((ulong)uVar1 >> 0x30);
    sStack_e80 = (short)uVar2;
    sStack_e7e = (short)((ulong)uVar2 >> 0x10);
    sStack_e7c = (short)((ulong)uVar2 >> 0x20);
    sStack_e7a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10c8;
    uVar2 = *(undefined8 *)(*local_10c8 + 8);
    local_be8 = (short)uVar1;
    sStack_be6 = (short)((ulong)uVar1 >> 0x10);
    sStack_be4 = (short)((ulong)uVar1 >> 0x20);
    sStack_be2 = (short)((ulong)uVar1 >> 0x30);
    sStack_be0 = (short)uVar2;
    sStack_bde = (short)((ulong)uVar2 >> 0x10);
    sStack_bdc = (short)((ulong)uVar2 >> 0x20);
    sStack_bda = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10b8;
    uVar2 = *(undefined8 *)(*local_10b8 + 8);
    local_ea8 = (short)uVar1;
    sStack_ea6 = (short)((ulong)uVar1 >> 0x10);
    sStack_ea4 = (short)((ulong)uVar1 >> 0x20);
    sStack_ea2 = (short)((ulong)uVar1 >> 0x30);
    sStack_ea0 = (short)uVar2;
    sStack_e9e = (short)((ulong)uVar2 >> 0x10);
    sStack_e9c = (short)((ulong)uVar2 >> 0x20);
    sStack_e9a = (short)((ulong)uVar2 >> 0x30);
    *(ulong *)*local_10d8 = ~local_1178 & local_12b8 | local_1178 & local_11d8;
    *(ulong *)(*local_10d8 + 8) = ~uStack_1170 & uStack_12b0 | uStack_1170 & uStack_11d0;
    *(ulong *)*local_10c8 = ~local_1178 & local_12a8 | local_1178 & local_11e8;
    *(ulong *)(*local_10c8 + 8) = ~uStack_1170 & uStack_12a0 | uStack_1170 & uStack_11e0;
    *(ulong *)*local_10d0 = ~local_1178 & local_1298 | local_1178 & local_11c8;
    *(ulong *)(*local_10d0 + 8) = ~uStack_1170 & uStack_1290 | uStack_1170 & uStack_11c0;
    *(ulong *)*local_10c0 = ~local_1178 & local_1288 | local_1178 & local_11b8;
    *(ulong *)(*local_10c0 + 8) = ~uStack_1170 & uStack_1280 | uStack_1170 & uStack_11b0;
    pauVar15 = local_10b8;
    uVar19 = *(ulong *)*local_10b8;
    uVar33 = *(ulong *)(*local_10b8 + 8);
    *(ulong *)*local_10b8 =
         local_1178 &
         CONCAT26((ushort)((sStack_e22 - sStack_bc2) + sStack_e82 +
                          (sStack_e42 - sStack_be2) + sStack_ea2) >> 3,
                  CONCAT24((ushort)((sStack_e24 - sStack_bc4) + sStack_e84 +
                                   (sStack_e44 - sStack_be4) + sStack_ea4) >> 3,
                           CONCAT22((ushort)((sStack_e26 - sStack_bc6) + sStack_e86 +
                                            (sStack_e46 - sStack_be6) + sStack_ea6) >> 3,
                                    (ushort)((local_e28 - local_bc8) + local_e88 +
                                            (local_e48 - local_be8) + local_ea8) >> 3)));
    *(ulong *)(*pauVar15 + 8) =
         uStack_1170 &
         CONCAT26((ushort)((sStack_e1a - sStack_bba) + sStack_e7a +
                          (sStack_e3a - sStack_bda) + sStack_e9a) >> 3,
                  CONCAT24((ushort)((sStack_e1c - sStack_bbc) + sStack_e7c +
                                   (sStack_e3c - sStack_bdc) + sStack_e9c) >> 3,
                           CONCAT22((ushort)((sStack_e1e - sStack_bbe) + sStack_e7e +
                                            (sStack_e3e - sStack_bde) + sStack_e9e) >> 3,
                                    (ushort)((sStack_e20 - sStack_bc0) + sStack_e80 +
                                            (sStack_e40 - sStack_be0) + sStack_ea0) >> 3)));
    uVar5 = *(ulong *)(*local_10b8 + 8);
    *(ulong *)*local_10b8 = ~local_1178 & uVar19 | *(ulong *)*local_10b8;
    *(ulong *)(*local_10b8 + 8) = ~uStack_1170 & uVar33 | uVar5;
    pauVar15 = local_10b0;
    local_9f8 = (uint)local_1178;
    uStack_9f4 = (uint)(local_1178 >> 0x20);
    uStack_9f0 = (uint)uStack_1170;
    uStack_9ec = (uint)(uStack_1170 >> 0x20);
    local_a08 = (uint)*(undefined8 *)*local_10b0;
    uStack_a04 = (uint)((ulong)*(undefined8 *)*local_10b0 >> 0x20);
    uStack_a00 = (uint)*(undefined8 *)(*local_10b0 + 8);
    uStack_9fc = (uint)((ulong)*(undefined8 *)(*local_10b0 + 8) >> 0x20);
    local_1188 = CONCAT44((uStack_9f4 ^ 0xffffffff) & uStack_a04,
                          (local_9f8 ^ 0xffffffff) & local_a08);
    uStack_1180 = CONCAT44((uStack_9ec ^ 0xffffffff) & uStack_9fc,
                           (uStack_9f0 ^ 0xffffffff) & uStack_a00);
    *(ulong *)*local_10b0 =
         local_1178 &
         CONCAT26((ushort)(sStack_c82 + sStack_c92 + sStack_ca2 + sStack_cc2) >> 3,
                  CONCAT24((ushort)(sStack_c84 + sStack_c94 + sStack_ca4 + sStack_cc4) >> 3,
                           CONCAT22((ushort)(sStack_c86 + sStack_c96 + sStack_ca6 + sStack_cc6) >> 3
                                    ,(ushort)(local_c88 + local_c98 + local_ca8 + local_cc8) >> 3)))
    ;
    *(ulong *)(*pauVar15 + 8) =
         uStack_1170 &
         CONCAT26((ushort)(sStack_c7a + sStack_c8a + sStack_c9a + sStack_cba) >> 3,
                  CONCAT24((ushort)(sStack_c7c + sStack_c8c + sStack_c9c + sStack_cbc) >> 3,
                           CONCAT22((ushort)(sStack_c7e + sStack_c8e + sStack_c9e + sStack_cbe) >> 3
                                    ,(ushort)(sStack_c80 + sStack_c90 + sStack_ca0 + sStack_cc0) >>
                                     3)));
    uVar19 = *(ulong *)(*local_10b0 + 8);
    *(ulong *)*local_10b0 = local_1188 | *(ulong *)*local_10b0;
    *(ulong *)(*local_10b0 + 8) = uStack_1180 | uVar19;
  }
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3) * -2);
  *puVar16 = mask_00;
  puVar16[1] = qs_00;
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 1) * -2);
  *puVar16 = local_1468;
  puVar16[1] = th;
  puVar16 = (undefined8 *)((long)in_RDI + (long)in_ESI * -2);
  *puVar16 = local_1478._0_8_;
  puVar16[1] = local_1478._8_8_;
  *in_RDI = local_1488._0_8_;
  in_RDI[1] = local_1488._8_8_;
  puVar16 = (undefined8 *)((long)in_RDI + (long)in_ESI * 2);
  *puVar16 = local_1498._0_8_;
  puVar16[1] = local_1498._8_8_;
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 1) * 2);
  *puVar16 = local_14a8._0_8_;
  puVar16[1] = local_14a8._8_8_;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_8_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p3, q3;

  p3 = _mm_loadu_si128((__m128i *)(s - 4 * p));
  q3 = _mm_loadu_si128((__m128i *)(s + 3 * p));
  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s + 0 * p));

  highbd_lpf_internal_8_dual_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0,
                                  _blimit0, _limit0, _thresh0, _blimit1,
                                  _limit1, _thresh1, bd);

  _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
  _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
  _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
  _mm_storeu_si128((__m128i *)(s + 0 * p), q0);
  _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
  _mm_storeu_si128((__m128i *)(s + 2 * p), q2);
}